

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleARGBCols64_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x32,int dx)

{
  long lVar1;
  int iVar2;
  
  lVar1 = (long)x32;
  if (1 < dst_width) {
    iVar2 = 0;
    do {
      *(undefined4 *)dst_argb = *(undefined4 *)(src_argb + (lVar1 >> 0x10) * 4);
      lVar1 = lVar1 + dx;
      *(undefined4 *)(dst_argb + 4) = *(undefined4 *)(src_argb + (lVar1 >> 0x10) * 4);
      lVar1 = lVar1 + dx;
      dst_argb = dst_argb + 8;
      iVar2 = iVar2 + 2;
    } while (iVar2 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *(undefined4 *)dst_argb = *(undefined4 *)(src_argb + (lVar1 >> 0x10) * 4);
  }
  return;
}

Assistant:

void ScaleARGBCols64_C(uint8_t* dst_argb,
                       const uint8_t* src_argb,
                       int dst_width,
                       int x32,
                       int dx) {
  int64_t x = (int64_t)(x32);
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[0] = src[x >> 16];
    x += dx;
    dst[1] = src[x >> 16];
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[x >> 16];
  }
}